

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O2

void whisper_print_usage(int param_1,char **argv,whisper_params *params)

{
  char *pcVar1;
  char *pcVar2;
  
  fputc(10,_stderr);
  fprintf(_stderr,"usage: %s [options]\n",*argv);
  fputc(10,_stderr);
  fwrite("options:\n",9,1,_stderr);
  fwrite("  -h,       --help        [default] show this help message and exit\n",0x44,1,_stderr);
  fprintf(_stderr,"  -t N,     --threads N   [%-7d] number of threads to use during computation\n",
          (ulong)(uint)params->n_threads);
  fprintf(_stderr,"  -m FNAME, --model FNAME [%-7s] model path\n",(params->model)._M_dataplus._M_p);
  fprintf(_stderr,"  -w N,     --what N      [%-7d] what to benchmark:\n",(ulong)(uint)params->what)
  ;
  fprintf(_stderr,"                           %-7s  0 - whisper\n","");
  fprintf(_stderr,"                           %-7s  1 - memcpy\n","");
  fprintf(_stderr,"                           %-7s  2 - ggml_mul_mat\n","");
  pcVar2 = "false";
  pcVar1 = "true";
  if (params->use_gpu != false) {
    pcVar1 = "false";
  }
  fprintf(_stderr,"  -ng,      --no-gpu      [%-7s] disable GPU\n",pcVar1);
  if (params->flash_attn != false) {
    pcVar2 = "true";
  }
  fprintf(_stderr,"  -fa,      --flash-attn  [%-7s] enable flash attention\n",pcVar2);
  fputc(10,_stderr);
  return;
}

Assistant:

void whisper_print_usage(int /*argc*/, char ** argv, const whisper_params & params) {
    fprintf(stderr, "\n");
    fprintf(stderr, "usage: %s [options]\n", argv[0]);
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h,       --help        [default] show this help message and exit\n");
    fprintf(stderr, "  -t N,     --threads N   [%-7d] number of threads to use during computation\n", params.n_threads);
    fprintf(stderr, "  -m FNAME, --model FNAME [%-7s] model path\n",                                  params.model.c_str());
    fprintf(stderr, "  -w N,     --what N      [%-7d] what to benchmark:\n",                          params.what);
    fprintf(stderr, "                           %-7s  0 - whisper\n",                                 "");
    fprintf(stderr, "                           %-7s  1 - memcpy\n",                                  "");
    fprintf(stderr, "                           %-7s  2 - ggml_mul_mat\n",                            "");
    fprintf(stderr, "  -ng,      --no-gpu      [%-7s] disable GPU\n",                                 params.use_gpu ? "false" : "true");
    fprintf(stderr, "  -fa,      --flash-attn  [%-7s] enable flash attention\n",                      params.flash_attn ? "true" : "false");
    fprintf(stderr, "\n");
}